

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O2

Cell * __thiscall TRM::SWRaster::find_cell(SWRaster *this)

{
  unordered_map<int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>_>
  *this_00;
  int32_t *__k;
  int iVar1;
  int iVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  long lVar5;
  size_t i;
  long lVar6;
  pointer pCVar7;
  pointer pCVar8;
  allocator_type local_31;
  vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> list;
  
  this_00 = &this->m_cells_y;
  __k = &this->m_ey;
  sVar3 = std::
          _Hashtable<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&this_00->_M_h,__k);
  if (sVar3 == 0) {
    std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::vector
              (&list,1,&local_31);
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator=(pmVar4,&list);
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    pCVar8 = (pmVar4->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar8->x = this->m_ex;
    pCVar8->cover = 0;
    pCVar8->area = 0;
    std::_Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::~_Vector_base
              (&list.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>);
  }
  else {
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    pCVar8 = (pmVar4->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = this->m_ex;
    lVar5 = 0;
    pCVar7 = pCVar8;
    for (lVar6 = 0;
        ((long)(pmVar4->
               super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)pCVar8) / 0xc != lVar6;
        lVar6 = lVar6 + 1) {
      iVar2 = pCVar7->x;
      if (iVar2 == iVar1) {
        return pCVar7;
      }
      if (iVar2 != iVar1 && iVar1 <= iVar2) {
        if ((int)lVar6 != -1) {
          list.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          list.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl
          .super__Vector_impl_data._M_finish._0_4_ = 0;
          std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::_M_insert_rval
                    (pmVar4,pCVar8 + (lVar5 >> 0x20),(value_type *)&list);
          pCVar8 = (pmVar4->
                   super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>).
                   _M_impl.super__Vector_impl_data._M_start + (lVar5 >> 0x20);
          goto LAB_0011166b;
        }
        break;
      }
      lVar5 = lVar5 + 0x100000000;
      pCVar7 = pCVar7 + 1;
    }
    list.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    list.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::
    emplace_back<TRM::SWRaster::Cell>(pmVar4,(Cell *)&list);
    pCVar8 = (pmVar4->super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>)
             ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_0011166b:
    pCVar8->x = this->m_ex;
    pCVar8->cover = 0;
    pCVar8->area = 0;
  }
  return pCVar8;
}

Assistant:

SWRaster::Cell* SWRaster::find_cell() {
  if (m_cells_y.count(m_ey) == 0) {
    std::vector<Cell> list(1);
    m_cells_y[m_ey] = list;

    auto cell = &m_cells_y[m_ey][0];
    cell->x = m_ex;
    cell->area = 0;
    cell->cover = 0;
    return cell;
  }

  auto& list = m_cells_y[m_ey];

  int32_t index = -1;
  for (size_t i = 0; i < list.size(); i++) {
    if (list[i].x == m_ex) {
      return &list[i];
    }

    if (list[i].x > m_ex) {
      index = i;
      break;
    }
  }

  Cell* cell = nullptr;
  if (index != -1) {
    list.insert(list.begin() + index, Cell{});
    cell = &list[index];
  } else {
    list.emplace_back(Cell{});
    cell = &list.back();
  }

  cell->x = m_ex;
  cell->area = 0;
  cell->cover = 0;

  return cell;
}